

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int transfer_set_delivery_tag(TRANSFER_HANDLE transfer,delivery_tag delivery_tag_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  TRANSFER_INSTANCE *transfer_instance;
  amqp_binary value;
  
  if (transfer == (TRANSFER_HANDLE)0x0) {
    iVar2 = 0x1d3f;
  }
  else {
    value._12_4_ = 0;
    value.bytes = (void *)SUB128(delivery_tag_value._0_12_,0);
    value.length = SUB124(delivery_tag_value._0_12_,8);
    item_value = amqpvalue_create_binary(value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x1d47;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(transfer->composite_value,2,item_value);
      iVar2 = 0x1d4d;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int transfer_set_delivery_tag(TRANSFER_HANDLE transfer, delivery_tag delivery_tag_value)
{
    int result;

    if (transfer == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)transfer;
        AMQP_VALUE delivery_tag_amqp_value = amqpvalue_create_delivery_tag(delivery_tag_value);
        if (delivery_tag_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(transfer_instance->composite_value, 2, delivery_tag_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(delivery_tag_amqp_value);
        }
    }

    return result;
}